

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointCloudGM.cpp
# Opt level: O0

string * __thiscall
csm::PointCloudGM::getFamily_abi_cxx11_(string *__return_storage_ptr__,PointCloudGM *this)

{
  allocator<char> local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  PointCloudGM *local_18;
  PointCloudGM *this_local;
  
  local_18 = this;
  this_local = (PointCloudGM *)__return_storage_ptr__;
  GeometricModel::getFamily_abi_cxx11_(&local_38,&this->super_GeometricModel);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"PointCloud",&local_59);
  std::operator+(__return_storage_ptr__,&local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string PointCloudGM::getFamily() const
{
   return GeometricModel::getFamily() + std::string(CSM_POINTCLOUD_FAMILY);
}